

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

Tagger * __thiscall MeCab::anon_unknown_0::ModelImpl::createTagger(ModelImpl *this)

{
  double dVar1;
  ModelImpl *pMVar2;
  TaggerImpl *this_00;
  
  if ((this->viterbi_ == (Viterbi *)0x0) || ((this->writer_).ptr_ == (Writer *)0x0)) {
    setGlobalError("Model is not available");
    this_00 = (TaggerImpl *)0x0;
  }
  else {
    this_00 = (TaggerImpl *)operator_new(0x60);
    TaggerImpl::TaggerImpl(this_00);
    pMVar2 = (this_00->model_).ptr_;
    if (pMVar2 != (ModelImpl *)0x0) {
      (*(pMVar2->super_Model)._vptr_Model[7])();
    }
    (this_00->model_).ptr_ = (ModelImpl *)0x0;
    this_00->current_model_ = this;
    this_00->request_type_ = this->request_type_;
    dVar1 = this->theta_;
    this_00->theta_ = dVar1;
    (*(this_00->super_Tagger)._vptr_Tagger[0x18])
              (CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1),this_00);
    (*(this_00->super_Tagger)._vptr_Tagger[0x10])(this_00,(ulong)(uint)this->request_type_);
  }
  return &this_00->super_Tagger;
}

Assistant:

bool is_available() const {
    return (viterbi_ && writer_.get());
  }